

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_hole.c
# Opt level: O0

void buffer_free(buffer_t *buffer)

{
  ulong local_18;
  zip_uint64_t i;
  buffer_t *buffer_local;
  
  if (buffer != (buffer_t *)0x0) {
    if (buffer->fragment != (zip_uint8_t **)0x0) {
      for (local_18 = 0; local_18 < buffer->nfragments; local_18 = local_18 + 1) {
        free(buffer->fragment[local_18]);
      }
      free(buffer->fragment);
    }
    free(buffer);
  }
  return;
}

Assistant:

static void
buffer_free(buffer_t *buffer) {
    zip_uint64_t i;

    if (buffer == NULL) {
	return;
    }

    if (buffer->fragment) {
	for (i = 0; i < buffer->nfragments; i++) {
	    free(buffer->fragment[i]);
	}
	free(buffer->fragment);
    }
    free(buffer);
}